

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

void __thiscall
ddd::DaTrie<false,_true,_false>::move_
          (DaTrie<false,_true,_false> *this,uint32_t node_pos,uint32_t base,Edge *edge,Query *query)

{
  uint uVar1;
  size_t sVar2;
  pointer pBVar3;
  pointer pNVar4;
  Bc BVar5;
  uint8_t *puVar6;
  uint node_pos_00;
  uint node_pos_01;
  size_t sVar7;
  ulong uVar8;
  uint8_t *__begin2;
  Edge src_edge;
  Edge local_138;
  
  uVar1 = *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                    super__Vector_impl_data._M_start + node_pos);
  sVar2 = edge->size_;
  puVar6 = edge->labels_;
  for (; edge != (Edge *)(puVar6 + sVar2); edge = (Edge *)(edge->labels_ + 1)) {
    node_pos_01 = uVar1 & 0x7fffffff ^ (uint)edge->labels_[0];
    node_pos_00 = edge->labels_[0] ^ base;
    fix_(this,node_pos_00,&this->blocks_);
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    pBVar3[node_pos_00] = pBVar3[node_pos_01];
    pNVar4 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pNVar4[node_pos_00] = pNVar4[node_pos_01];
    memset(&local_138,0,0x108);
    edge_(this,node_pos_01,&local_138,0x100);
    BVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
            super__Vector_impl_data._M_start[node_pos_01];
    for (sVar7 = 0; local_138.size_ != sVar7; sVar7 = sVar7 + 1) {
      uVar8 = (ulong)local_138.labels_[sVar7] ^ (ulong)(BVar5._0_4_ & 0x7fffffff);
      pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      pBVar3[uVar8] =
           (Bc)((ulong)pBVar3[uVar8] & 0x80000000ffffffff |
               (ulong)(node_pos_00 & 0x7fffffff) << 0x20);
    }
    unfix_(this,node_pos_01,&this->blocks_);
    if (node_pos_01 == query->node_pos_) {
      query->node_pos_ = node_pos_00;
    }
  }
  *(uint32_t *)
   ((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
    super__Vector_impl_data._M_start + node_pos) = base & 0x7fffffff;
  return;
}

Assistant:

void move_(uint32_t node_pos, uint32_t base, const Edge& edge, Query& query) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(0 < edge.size());

    auto orig_base = bc_[node_pos].base();

    for (auto label : edge) {
      auto src_node_pos = orig_base ^label;
      auto dst_node_pos = base ^label;

      fix_(dst_node_pos, blocks_);
      bc_[dst_node_pos] = bc_[src_node_pos];
      if (WithNLM) {
        node_links_[dst_node_pos] = node_links_[src_node_pos];
      }

      Edge src_edge;
      edge_(src_node_pos, src_edge);

      auto src_base = bc_[src_node_pos].base();
      for (auto src_label : src_edge) {
        auto src_child_pos = src_base ^src_label;
        bc_[src_child_pos].set_check(dst_node_pos);
      }

      unfix_(src_node_pos, blocks_);

      if (src_node_pos == query.node_pos()) {
        query.set_node_pos(dst_node_pos);
      }
    }

    bc_[node_pos].set_base(base);
  }